

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_> *node)

{
  long *plVar1;
  long *plVar2;
  long *in_RDX;
  long *local_30;
  long *local_28;
  long *local_20;
  
  local_20 = *(long **)(*in_RDX + 8);
  *(undefined8 *)(*in_RDX + 8) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Replicate_*,_std::default_delete<verilogAST::Replicate>_>
              .super__Head_base<0UL,_verilogAST::Replicate_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(&local_30);
  plVar2 = local_30;
  local_30 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 8);
  *(long **)(*in_RDX + 8) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x10))();
  }
  local_30 = (long *)0x0;
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 0x10))();
  }
  local_20 = (long *)0x0;
  local_28 = *(long **)(*in_RDX + 0x10);
  *(undefined8 *)(*in_RDX + 0x10) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Replicate_*,_std::default_delete<verilogAST::Replicate>_>
              .super__Head_base<0UL,_verilogAST::Replicate_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(&local_30,node);
  plVar2 = local_30;
  local_30 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 0x10);
  *(long **)(*in_RDX + 0x10) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x10))();
  }
  local_30 = (long *)0x0;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 0x10))();
  }
  this->_vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>,_true,_true>
          )(__uniq_ptr_data<verilogAST::Replicate,_std::default_delete<verilogAST::Replicate>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Replicate> Transformer::visit(std::unique_ptr<Replicate> node) {
  node->num = this->visit(std::move(node->num));
  node->value = this->visit(std::move(node->value));
  return node;
}